

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int jsonEachBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  sqlite3_index_constraint_usage *psVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uchar *puVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int aIdx [2];
  
  aIdx[0] = -1;
  aIdx[1] = -1;
  iVar6 = pIdxInfo->nConstraint;
  uVar2 = 0;
  if (iVar6 < 1) {
    iVar6 = 0;
  }
  puVar5 = &pIdxInfo->aConstraint->usable;
  uVar7 = 0;
  for (iVar8 = 0; iVar6 != iVar8; iVar8 = iVar8 + 1) {
    if (7 < ((sqlite3_index_constraint *)(puVar5 + -5))->iColumn) {
      uVar3 = ((sqlite3_index_constraint *)(puVar5 + -5))->iColumn - 8;
      uVar9 = 1 << ((byte)uVar3 & 0x1f);
      if (*puVar5 == '\0') {
        uVar2 = uVar2 | uVar9;
      }
      else if (puVar5[-1] == '\x02') {
        aIdx[uVar3] = iVar8;
        uVar7 = uVar7 | uVar9;
      }
    }
    puVar5 = puVar5 + 0xc;
  }
  if ((uVar2 & ~uVar7) != 0) {
    return 0x13;
  }
  lVar4 = (long)aIdx[0];
  iVar6 = 0;
  if (-1 < lVar4) {
    pIdxInfo->estimatedCost = 1.0;
    psVar1 = pIdxInfo->aConstraintUsage;
    psVar1[lVar4].argvIndex = 1;
    psVar1[lVar4].omit = '\x01';
    lVar4 = (long)aIdx[1];
    iVar6 = 1;
    if (-1 < lVar4) {
      psVar1[lVar4].argvIndex = 2;
      psVar1[lVar4].omit = '\x01';
      iVar6 = 3;
    }
  }
  pIdxInfo->idxNum = iVar6;
  return 0;
}

Assistant:

static int jsonEachBestIndex(
  sqlite3_vtab *tab,
  sqlite3_index_info *pIdxInfo
){
  int i;                     /* Loop counter or computed array index */
  int aIdx[2];               /* Index of constraints for JSON and ROOT */
  int unusableMask = 0;      /* Mask of unusable JSON and ROOT constraints */
  int idxMask = 0;           /* Mask of usable == constraints JSON and ROOT */
  const struct sqlite3_index_constraint *pConstraint;

  /* This implementation assumes that JSON and ROOT are the last two
  ** columns in the table */
  assert( JEACH_ROOT == JEACH_JSON+1 );
  UNUSED_PARAM(tab);
  aIdx[0] = aIdx[1] = -1;
  pConstraint = pIdxInfo->aConstraint;
  for(i=0; i<pIdxInfo->nConstraint; i++, pConstraint++){
    int iCol;
    int iMask;
    if( pConstraint->iColumn < JEACH_JSON ) continue;
    iCol = pConstraint->iColumn - JEACH_JSON;
    assert( iCol==0 || iCol==1 );
    iMask = 1 << iCol;
    if( pConstraint->usable==0 ){
      unusableMask |= iMask;
    }else if( pConstraint->op==SQLITE_INDEX_CONSTRAINT_EQ ){
      aIdx[iCol] = i;
      idxMask |= iMask;
    }
  }
  if( (unusableMask & ~idxMask)!=0 ){
    /* If there are any unusable constraints on JSON or ROOT, then reject
    ** this entire plan */
    return SQLITE_CONSTRAINT;
  }
  if( aIdx[0]<0 ){
    /* No JSON input.  Leave estimatedCost at the huge value that it was
    ** initialized to to discourage the query planner from selecting this
    ** plan. */
    pIdxInfo->idxNum = 0;
  }else{
    pIdxInfo->estimatedCost = 1.0;
    i = aIdx[0];
    pIdxInfo->aConstraintUsage[i].argvIndex = 1;
    pIdxInfo->aConstraintUsage[i].omit = 1;
    if( aIdx[1]<0 ){
      pIdxInfo->idxNum = 1;  /* Only JSON supplied.  Plan 1 */
    }else{
      i = aIdx[1];
      pIdxInfo->aConstraintUsage[i].argvIndex = 2;
      pIdxInfo->aConstraintUsage[i].omit = 1;
      pIdxInfo->idxNum = 3;  /* Both JSON and ROOT are supplied.  Plan 3 */
    }
  }
  return SQLITE_OK;
}